

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::UnaryExpression::serializeTo(UnaryExpression *this,ASTSerializer *serializer)

{
  Expression *__n;
  ASTSerializer *in_RSI;
  UnaryExpression *in_RDI;
  string_view sVar1;
  char *in_stack_ffffffffffffffb8;
  int __fd;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sVar1 = ast::toString(Plus);
  local_30 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,(char *)in_RSI);
  __fd = (int)in_stack_ffffffffffffffc0;
  __n = operand(in_RDI);
  ASTSerializer::write(in_RSI,__fd,local_38,(size_t)__n);
  return;
}

Assistant:

void UnaryExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("operand", operand());
}